

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumStatement
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location)

{
  Location *parent;
  bool bVar1;
  int path2;
  EnumOptions *options;
  EnumValueDescriptorProto *enum_value;
  undefined1 local_58 [8];
  LocationRecorder location_1;
  undefined1 local_38 [8];
  LocationRecorder location;
  LocationRecorder *enum_location_local;
  EnumDescriptorProto *enum_type_local;
  Parser *this_local;
  
  location.location_ = (Location *)enum_location;
  bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = LookingAt(this,"option");
    parent = location.location_;
    if (bVar1) {
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_38,(LocationRecorder *)location.location_,3);
      options = EnumDescriptorProto::mutable_options(enum_type);
      this_local._7_1_ =
           ParseOption(this,&options->super_Message,(LocationRecorder *)local_38,OPTION_STATEMENT);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_38);
    }
    else {
      path2 = EnumDescriptorProto::value_size(enum_type);
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_58,(LocationRecorder *)parent,2,path2);
      enum_value = EnumDescriptorProto::add_value(enum_type);
      this_local._7_1_ = ParseEnumConstant(this,enum_value,(LocationRecorder *)local_58);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_58);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseEnumStatement(EnumDescriptorProto* enum_type,
                                const LocationRecorder& enum_location) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kOptionsFieldNumber);
    return ParseOption(enum_type->mutable_options(), location,
                       OPTION_STATEMENT);
  } else {
    LocationRecorder location(enum_location,
        EnumDescriptorProto::kValueFieldNumber, enum_type->value_size());
    return ParseEnumConstant(enum_type->add_value(), location);
  }
}